

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_gather_single(bsc_step_t depends,bsc_pid_t root,bsc_group_t group,void *src,void *dst,
                 bsc_size_t size)

{
  uint uVar1;
  bsp_pid_t bVar2;
  ulong uVar3;
  bsc_pid_t src_pid;
  ulong uVar4;
  
  if (group == (bsc_group_t)0x0) {
    uVar1 = bsp_nprocs();
  }
  else {
    uVar1 = *group;
  }
  bVar2 = bsp_pid();
  if (bVar2 == root) {
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if (group == (bsc_group_t)0x0) {
        src_pid = (bsc_pid_t)uVar4;
      }
      else {
        src_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + uVar4 * 4);
      }
      bsc_get(depends,src_pid,src,0,dst,size);
      dst = (void *)((long)dst + (long)size);
    }
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_gather_single( bsc_step_t depends, 
                       bsc_pid_t root, bsc_group_t group,
                       const void * src, void *dst, bsc_size_t size )
{
    const group_t * g = group;
    bsc_pid_t i, P = g?g->size:bsp_nprocs() ;
    if ( bsp_pid() == root ) {
        for ( i = 0; i < P; ++i ) {
            bsc_pid_t m = g?g->gid[i]:i;
            char * dst_bytes = dst;
            bsc_get( depends, m, src, 0, dst_bytes + i * size, size );
        }
    }

    return depends + 1;
}